

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphbuilderadapter.cpp
# Opt level: O0

void __thiscall
YAML::GraphBuilderAdapter::OnMapStart
          (GraphBuilderAdapter *this,Mark *mark,string *tag,anchor_t anchor,value param_5)

{
  int iVar1;
  void *pvVar2;
  undefined4 extraout_var;
  GraphBuilderAdapter *this_00;
  anchor_t in_RDX;
  stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
  *in_RSI;
  long in_RDI;
  void *pNode;
  GraphBuilderAdapter *this_01;
  ContainerFrame local_40;
  void *local_30;
  
  this_01 = *(GraphBuilderAdapter **)(in_RDI + 8);
  pvVar2 = GetCurrentParent(this_01);
  iVar1 = (*(this_01->super_EventHandler)._vptr_EventHandler[7])(this_01,in_RSI,in_RDX,pvVar2);
  local_30 = (void *)CONCAT44(extraout_var,iVar1);
  this_00 = (GraphBuilderAdapter *)(in_RDI + 0x10);
  ContainerFrame::ContainerFrame(&local_40,local_30,*(void **)(in_RDI + 0x80));
  std::
  stack<YAML::GraphBuilderAdapter::ContainerFrame,_std::deque<YAML::GraphBuilderAdapter::ContainerFrame,_std::allocator<YAML::GraphBuilderAdapter::ContainerFrame>_>_>
  ::push(in_RSI,(value_type_conflict *)this_01);
  *(undefined8 *)(in_RDI + 0x80) = 0;
  RegisterAnchor(this_00,in_RDX,in_RSI);
  return;
}

Assistant:

void GraphBuilderAdapter::OnMapStart(const Mark &mark, const std::string &tag,
                                     anchor_t anchor,
                                     EmitterStyle::value /* style */) {
  void *pNode = m_builder.NewMap(mark, tag, GetCurrentParent());
  m_containers.push(ContainerFrame(pNode, m_pKeyNode));
  m_pKeyNode = nullptr;
  RegisterAnchor(anchor, pNode);
}